

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxShortLeave(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *sel,int leave,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *maxabs)

{
  undefined8 uVar1;
  type_conflict5 tVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  pointer pnVar4;
  ulong uVar5;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  shortval;
  cpp_dec_float<100U,_int,_void> local_128;
  undefined1 local_d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  uint local_c8 [11];
  undefined3 uStack_9b;
  int iStack_98;
  bool bStack_94;
  undefined8 local_90;
  cpp_dec_float<100U,_int,_void> local_80;
  
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_d8,
             &(this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar5 = -(ulong)(*(Real *)((long)local_d8 + 0x40) == 1.0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_80,
             (double)(~uVar5 & (ulong)(*(Real *)((long)local_d8 + 0x40) * 1e-05) |
                     uVar5 & 0x3ee4f8b588e368f1),(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_d0);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_d8,
               &((this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver)->theFvec->thedelta,leave);
  *(undefined8 *)((sel->m_backend).data._M_elems + 0xc) = local_c8._32_8_;
  *(ulong *)((sel->m_backend).data._M_elems + 0xe) = CONCAT35(uStack_9b,stack0xffffffffffffff60);
  *(undefined8 *)((sel->m_backend).data._M_elems + 8) = local_c8._16_8_;
  *(undefined8 *)((sel->m_backend).data._M_elems + 10) = local_c8._24_8_;
  *(undefined8 *)((sel->m_backend).data._M_elems + 4) = local_c8._0_8_;
  *(undefined8 *)((sel->m_backend).data._M_elems + 6) = local_c8._8_8_;
  *(undefined1 (*) [8])(sel->m_backend).data._M_elems = local_d8;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((sel->m_backend).data._M_elems + 2) =
       _Stack_d0._M_pi;
  (sel->m_backend).exp = iStack_98;
  (sel->m_backend).neg = bStack_94;
  (sel->m_backend).fpclass = (fpclass_type)local_90;
  (sel->m_backend).prec_elem = local_90._4_4_;
  local_90._0_4_ = cpp_dec_float_finite;
  local_90._4_4_ = 0x10;
  local_d8 = (undefined1  [8])0x0;
  _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c8[0] = 0;
  local_c8[1] = 0;
  local_c8[2] = 0;
  local_c8[3] = 0;
  local_c8[4] = 0;
  local_c8[5] = 0;
  local_c8[6] = 0;
  local_c8[7] = 0;
  local_c8[8] = 0;
  local_c8[9] = 0;
  stack0xffffffffffffff60 = 0;
  uStack_9b = 0;
  iStack_98 = 0;
  bStack_94 = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            ((cpp_dec_float<100U,_int,_void> *)local_d8,&maxabs->m_backend,&local_80);
  tVar2 = boost::multiprecision::operator>
                    (sel,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_d8);
  if (tVar2) {
    pSVar3 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    pnVar4 = (pSVar3->theUBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    local_128.data._M_elems._0_8_ = *(undefined8 *)(maxabs->m_backend).data._M_elems;
    local_128.data._M_elems._8_8_ = *(undefined8 *)((maxabs->m_backend).data._M_elems + 2);
    local_128.data._M_elems._16_8_ = *(undefined8 *)((maxabs->m_backend).data._M_elems + 4);
    local_128.data._M_elems._24_8_ = *(undefined8 *)((maxabs->m_backend).data._M_elems + 6);
    local_128.data._M_elems._32_8_ = *(undefined8 *)((maxabs->m_backend).data._M_elems + 8);
    local_128.data._M_elems._40_8_ = *(undefined8 *)((maxabs->m_backend).data._M_elems + 10);
    local_128.data._M_elems._48_8_ = *(undefined8 *)((maxabs->m_backend).data._M_elems + 0xc);
    uVar1 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 0xe);
    local_128.data._M_elems._56_5_ = SUB85(uVar1,0);
    local_128.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar1 >> 0x28);
    local_128.exp = (maxabs->m_backend).exp;
    local_128.neg = (maxabs->m_backend).neg;
    local_128.fpclass = (maxabs->m_backend).fpclass;
    local_128.prec_elem = (maxabs->m_backend).prec_elem;
    if (local_128.fpclass != cpp_dec_float_finite || local_128.data._M_elems[0] != 0) {
      local_128.neg = (bool)(local_128.neg ^ 1);
    }
    local_90._0_4_ = cpp_dec_float_finite;
    local_90._4_4_ = 0x10;
    local_d8 = (undefined1  [8])0x0;
    _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_c8[0] = 0;
    local_c8[1] = 0;
    local_c8[2] = 0;
    local_c8[3] = 0;
    local_c8[4] = 0;
    local_c8[5] = 0;
    local_c8[6] = 0;
    local_c8[7] = 0;
    local_c8[8] = 0;
    local_c8[9] = 0;
    stack0xffffffffffffff60 = 0;
    uStack_9b = 0;
    iStack_98 = 0;
    bStack_94 = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              ((cpp_dec_float<100U,_int,_void> *)local_d8,&local_128,&local_80);
    tVar2 = boost::multiprecision::operator<
                      (sel,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_d8);
    if (!tVar2) {
      return false;
    }
    pSVar3 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    pnVar4 = (pSVar3->theLBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  local_128.fpclass = cpp_dec_float_finite;
  local_128.prec_elem = 0x10;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems[6] = 0;
  local_128.data._M_elems[7] = 0;
  local_128.data._M_elems[8] = 0;
  local_128.data._M_elems[9] = 0;
  local_128.data._M_elems[10] = 0;
  local_128.data._M_elems[0xb] = 0;
  local_128.data._M_elems[0xc] = 0;
  local_128.data._M_elems[0xd] = 0;
  local_128.data._M_elems._56_5_ = 0;
  local_128.data._M_elems[0xf]._1_3_ = 0;
  local_128.exp = 0;
  local_128.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_128,&pnVar4[leave].m_backend,
             &(pSVar3->theFvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[leave].m_backend);
  local_90._0_4_ = cpp_dec_float_finite;
  local_90._4_4_ = 0x10;
  local_d8 = (undefined1  [8])0x0;
  _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c8[0] = 0;
  local_c8[1] = 0;
  local_c8[2] = 0;
  local_c8[3] = 0;
  local_c8[4] = 0;
  local_c8[5] = 0;
  local_c8[6] = 0;
  local_c8[7] = 0;
  local_c8[8] = 0;
  local_c8[9] = 0;
  stack0xffffffffffffff60 = 0;
  uStack_9b = 0;
  iStack_98 = 0;
  bStack_94 = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            ((cpp_dec_float<100U,_int,_void> *)local_d8,&local_128,&sel->m_backend);
  *(undefined8 *)((sel->m_backend).data._M_elems + 0xc) = local_c8._32_8_;
  *(ulong *)((sel->m_backend).data._M_elems + 0xe) = CONCAT35(uStack_9b,stack0xffffffffffffff60);
  *(undefined8 *)((sel->m_backend).data._M_elems + 8) = local_c8._16_8_;
  *(undefined8 *)((sel->m_backend).data._M_elems + 10) = local_c8._24_8_;
  *(undefined8 *)((sel->m_backend).data._M_elems + 4) = local_c8._0_8_;
  *(undefined8 *)((sel->m_backend).data._M_elems + 6) = local_c8._8_8_;
  *(undefined1 (*) [8])(sel->m_backend).data._M_elems = local_d8;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((sel->m_backend).data._M_elems + 2) =
       _Stack_d0._M_pi;
  (sel->m_backend).exp = iStack_98;
  (sel->m_backend).neg = bStack_94;
  (sel->m_backend).fpclass = (fpclass_type)local_90;
  (sel->m_backend).prec_elem = local_90._4_4_;
  return true;
}

Assistant:

bool SPxFastRT<R>::maxShortLeave(R& sel, int leave, R maxabs)
{
   assert(leave >= 0);
   assert(maxabs >= 0);

   R shortval = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_SHORTVAL);

   sel = this->thesolver->fVec().delta()[leave];

   if(sel > maxabs * shortval)
   {
      sel = (this->thesolver->ubBound()[leave] - this->thesolver->fVec()[leave]) / sel;
      return true;
   }

   if(sel < -maxabs * shortval)
   {
      sel = (this->thesolver->lbBound()[leave] - this->thesolver->fVec()[leave]) / sel;
      return true;
   }

   return false;
}